

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableLayout.cpp
# Opt level: O1

void __thiscall KDReports::TableLayout::updateRowHeight(TableLayout *this)

{
  double dVar1;
  double dVar2;
  QFontMetricsF local_20 [8];
  double local_18;
  
  local_18 = this->m_fixedRowHeight;
  if (this->m_fixedRowHeight <= 0.0) {
    QFontMetricsF::QFontMetricsF(local_20,&(this->m_cellFontScaler).m_fontMetrics);
    dVar1 = (double)QFontMetricsF::height();
    dVar2 = this->m_cellPadding * (this->m_cellFontScaler).m_scalingFactor;
    this->m_rowHeight = dVar2 + dVar2 + dVar1;
    QFontMetricsF::~QFontMetricsF(local_20);
    if (this->m_horizontalHeaderVisible == true) {
      QFontMetricsF::QFontMetricsF(local_20,&(this->m_horizontalHeaderFontScaler).m_fontMetrics);
      dVar1 = (double)QFontMetricsF::height();
      dVar2 = this->m_cellPadding * (this->m_cellFontScaler).m_scalingFactor;
      this->m_hHeaderHeight = dVar2 + dVar2 + dVar1;
      QFontMetricsF::~QFontMetricsF(local_20);
    }
    if (this->m_verticalHeaderVisible != true) {
      return;
    }
    QFontMetricsF::QFontMetricsF(local_20,&(this->m_verticalHeaderFontScaler).m_fontMetrics);
    local_18 = (double)QFontMetricsF::height();
    dVar1 = this->m_cellPadding * (this->m_cellFontScaler).m_scalingFactor;
    local_18 = dVar1 + dVar1 + local_18;
    QFontMetricsF::~QFontMetricsF(local_20);
    if (local_18 <= this->m_rowHeight) {
      local_18 = this->m_rowHeight;
    }
  }
  this->m_rowHeight = local_18;
  return;
}

Assistant:

void TableLayout::updateRowHeight()
{
    if (m_fixedRowHeight > 0) {
        m_rowHeight = m_fixedRowHeight;
        return;
    }
    m_rowHeight = m_cellFontScaler.fontMetrics().height() + 2.0 * scaledCellPadding();
    if (m_horizontalHeaderVisible) {
        m_hHeaderHeight = m_horizontalHeaderFontScaler.fontMetrics().height() + 2.0 * scaledCellPadding();
    }
    if (m_verticalHeaderVisible) {
        qreal vHeaderHeight = m_verticalHeaderFontScaler.fontMetrics().height() + 2.0 * scaledCellPadding();
#ifdef DEBUG_LAYOUT
        qDebug() << "cells say rowHeight=" << m_rowHeight << "vHeader says height=" << vHeaderHeight;
#endif
        m_rowHeight = qMax(m_rowHeight, vHeaderHeight);
    }
}